

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_3::DBIter::Prev(DBIter *this)

{
  Comparator *pCVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  pointer local_50;
  size_type local_48;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                  ,0xd2,"virtual void leveldb::(anonymous namespace)::DBIter::Prev()");
  }
  if (this->direction_ == kForward) {
    iVar3 = (*this->iter_->_vptr_Iterator[2])();
    if ((char)iVar3 == '\0') {
      __assert_fail("iter_->Valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                    ,0xd7,"virtual void leveldb::(anonymous namespace)::DBIter::Prev()");
    }
    iVar3 = (*this->iter_->_vptr_Iterator[8])();
    if (extraout_RDX < 8) {
LAB_0012d272:
      __assert_fail("internal_key.size() >= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.h"
                    ,0x5e,"Slice leveldb::ExtractUserKey(const Slice &)");
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->saved_key_,0,(char *)(this->saved_key_)._M_string_length,
               CONCAT44(extraout_var,iVar3));
    do {
      (*this->iter_->_vptr_Iterator[7])();
      iVar3 = (*this->iter_->_vptr_Iterator[2])();
      if ((char)iVar3 == '\0') {
        this->valid_ = false;
        (this->saved_key_)._M_string_length = 0;
        *(this->saved_key_)._M_dataplus._M_p = '\0';
        pcVar2 = (this->saved_value_)._M_dataplus._M_p;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar2 != &(this->saved_value_).field_2) &&
           (0x100000 < (this->saved_value_).field_2._M_allocated_capacity)) {
          local_38 = 0;
          local_30[0] = 0;
          local_40 = local_30;
          std::__cxx11::string::swap((string *)&local_40);
          if (local_40 == local_30) {
            return;
          }
          operator_delete(local_40);
          return;
        }
        (this->saved_value_)._M_string_length = 0;
        *pcVar2 = '\0';
        return;
      }
      pCVar1 = this->user_comparator_;
      iVar3 = (*this->iter_->_vptr_Iterator[8])();
      if (extraout_RDX_00 < 8) goto LAB_0012d272;
      local_38 = extraout_RDX_00 - 8;
      local_50 = (this->saved_key_)._M_dataplus._M_p;
      local_48 = (this->saved_key_)._M_string_length;
      local_40 = (undefined1 *)CONCAT44(extraout_var_00,iVar3);
      iVar3 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_40,&local_50);
    } while (-1 < iVar3);
    this->direction_ = kReverse;
  }
  FindPrevUserEntry(this);
  return;
}

Assistant:

void DBIter::Prev() {
  assert(valid_);

  if (direction_ == kForward) {  // Switch directions?
    // iter_ is pointing at the current entry.  Scan backwards until
    // the key changes so we can use the normal reverse scanning code.
    assert(iter_->Valid());  // Otherwise valid_ would have been false
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
    while (true) {
      iter_->Prev();
      if (!iter_->Valid()) {
        valid_ = false;
        saved_key_.clear();
        ClearSavedValue();
        return;
      }
      if (user_comparator_->Compare(ExtractUserKey(iter_->key()), saved_key_) <
          0) {
        break;
      }
    }
    direction_ = kReverse;
  }

  FindPrevUserEntry();
}